

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O0

void narrow_stripov_backprop(NarrowConv *nc,IRRef ref,int depth)

{
  byte bVar1;
  NarrowIns *pNVar2;
  uint *puVar3;
  int depth_00;
  IRIns *pIVar4;
  BPropEntry *pBVar5;
  NarrowIns *savesp;
  BPropEntry *bp;
  IRIns *ir;
  jit_State *J;
  int depth_local;
  IRRef ref_local;
  NarrowConv *nc_local;
  
  pIVar4 = (nc->J->cur).ir + ref;
  J._4_4_ = ref;
  if ((((pIVar4->field_1).o == '5') || ((pIVar4->field_1).o == '6')) ||
     (((pIVar4->field_1).o == '7' && ((nc->mode & 0xf000) == 0x1000)))) {
    pBVar5 = narrow_bpc_get(nc->J,(IRRef1)ref,0);
    if (pBVar5 == (BPropEntry *)0x0) {
      depth_00 = depth + 1;
      if ((depth_00 < 100) && (nc->sp < nc->maxsp)) {
        pNVar2 = nc->sp;
        narrow_stripov_backprop(nc,(uint)(pIVar4->field_0).op1,depth_00);
        if ((nc->sp < nc->maxsp) &&
           (narrow_stripov_backprop(nc,(uint)*(ushort *)((long)pIVar4 + 2),depth_00),
           nc->sp < nc->maxsp)) {
          bVar1 = (pIVar4->field_1).o;
          pNVar2 = nc->sp;
          nc->sp = pNVar2 + 1;
          *pNVar2 = ((bVar1 - 0xc) * 0x100 | 0x13) * 0x10000 + ref;
          return;
        }
        nc->sp = pNVar2;
      }
    }
    else {
      J._4_4_ = (IRRef)pBVar5->val;
    }
  }
  puVar3 = nc->sp;
  nc->sp = puVar3 + 1;
  *puVar3 = J._4_4_;
  return;
}

Assistant:

static void narrow_stripov_backprop(NarrowConv *nc, IRRef ref, int depth)
{
  jit_State *J = nc->J;
  IRIns *ir = IR(ref);
  if (ir->o == IR_ADDOV || ir->o == IR_SUBOV ||
      (ir->o == IR_MULOV && (nc->mode & IRCONV_CONVMASK) == IRCONV_ANY)) {
    BPropEntry *bp = narrow_bpc_get(nc->J, ref, IRCONV_TOBIT);
    if (bp) {
      ref = bp->val;
    } else if (++depth < NARROW_MAX_BACKPROP && nc->sp < nc->maxsp) {
      NarrowIns *savesp = nc->sp;
      narrow_stripov_backprop(nc, ir->op1, depth);
      if (nc->sp < nc->maxsp) {
	narrow_stripov_backprop(nc, ir->op2, depth);
	if (nc->sp < nc->maxsp) {
	  *nc->sp++ = NARROWINS(IRT(ir->o - IR_ADDOV + IR_ADD, IRT_INT), ref);
	  return;
	}
      }
      nc->sp = savesp;  /* Path too deep, need to backtrack. */
    }
  }
  *nc->sp++ = NARROWINS(NARROW_REF, ref);
}